

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstdpp.hpp
# Opt level: O2

size_buffer_t
zstdpp::inplace::compress(buffer_t *data,buffer_t *buffer,compress_level_t compress_level)

{
  pointer puVar1;
  size_type sVar2;
  undefined7 in_register_00000011;
  
  sVar2 = ZSTD_compressBound((long)(data->
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(data->
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   )._M_impl.super__Vector_impl_data._M_start);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(buffer,sVar2);
  puVar1 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  sVar2 = ZSTD_compress((buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_start,sVar2,puVar1,
                        (long)(data->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar1,
                        CONCAT71(in_register_00000011,compress_level) & 0xffffffff);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(buffer,sVar2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_shrink_to_fit(buffer);
  return (long)(buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
}

Assistant:

inline size_buffer_t compress(
        buffer_t const& data,
        buffer_t& buffer,
        compress_level_t compress_level = 3
    ) {
      size_t est_compress_size = ZSTD_compressBound(data.size());
    
      buffer.resize(est_compress_size);
    
      auto compress_size = ZSTD_compress((void*)buffer.data(), est_compress_size,
                                         data.data(), data.size(), compress_level);
    
      buffer.resize(compress_size);
      buffer.shrink_to_fit();
    
      return buffer.size();
    }